

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void jsonPatchFunc(sqlite3_context *ctx,int argc,sqlite3_value **argv)

{
  int iVar1;
  uchar *puVar2;
  JsonNode *pNode;
  JsonParse *pParse;
  JsonParse x;
  JsonParse y;
  JsonParse JStack_78;
  JsonParse local_48;
  
  puVar2 = sqlite3_value_text(*argv);
  iVar1 = jsonParse(&JStack_78,ctx,(char *)puVar2);
  if (iVar1 == 0) {
    puVar2 = sqlite3_value_text(argv[1]);
    iVar1 = jsonParse(&local_48,ctx,(char *)puVar2);
    pParse = &JStack_78;
    if (iVar1 == 0) {
      pNode = jsonMergePatch(&JStack_78,0,local_48.aNode);
      if (pNode == (JsonNode *)0x0) {
        sqlite3_result_error_nomem(ctx);
      }
      else {
        jsonReturnJson(pNode,ctx,(sqlite3_value **)0x0);
      }
      jsonParseReset(&JStack_78);
      pParse = &local_48;
    }
    jsonParseReset(pParse);
  }
  return;
}

Assistant:

static void jsonPatchFunc(
  sqlite3_context *ctx,
  int argc,
  sqlite3_value **argv
){
  JsonParse x;     /* The JSON that is being patched */
  JsonParse y;     /* The patch */
  JsonNode *pResult;   /* The result of the merge */

  UNUSED_PARAMETER(argc);
  if( jsonParse(&x, ctx, (const char*)sqlite3_value_text(argv[0])) ) return;
  if( jsonParse(&y, ctx, (const char*)sqlite3_value_text(argv[1])) ){
    jsonParseReset(&x);
    return;
  }
  pResult = jsonMergePatch(&x, 0, y.aNode);
  assert( pResult!=0 || x.oom );
  if( pResult ){
    jsonReturnJson(pResult, ctx, 0);
  }else{
    sqlite3_result_error_nomem(ctx);
  }
  jsonParseReset(&x);
  jsonParseReset(&y);
}